

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inter.h
# Opt level: O2

string * __thiscall Unary::toString_abi_cxx11_(string *__return_storage_ptr__,Unary *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  (**((this->super_Op).super_Expr.op.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     _vptr_Token)(&local_38);
  std::operator+(&local_58,&local_38," ");
  (*(((this->expr).super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->super_Node).
    _vptr_Node[6])(&bStack_78);
  std::operator+(__return_storage_ptr__,&local_58,&bStack_78);
  std::__cxx11::string::~string((string *)&bStack_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string toString() override {
		return op->toString() + " " + expr->toString();
	}